

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

bool __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::nextMemoryType(MemoryTestInstance *this)

{
  bool bVar1;
  MemoryTestInstance *this_local;
  
  resetResources(this);
  this->m_memoryTypeNdx = this->m_memoryTypeNdx + 1;
  bVar1 = (this->m_memoryProperties).memoryTypeCount <= this->m_memoryTypeNdx;
  if (bVar1) {
    *(undefined8 *)&this->field_0x258 = 0;
    this->m_stage = 0;
  }
  else {
    this->m_iteration = 0;
    this->m_stage = (StageFunc)createCommandsAndAllocateMemory;
    *(undefined8 *)&this->field_0x258 = 0;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool MemoryTestInstance::nextMemoryType (void)
{
	resetResources();

	DE_ASSERT(m_commands.empty());

	m_memoryTypeNdx++;

	if (m_memoryTypeNdx < m_memoryProperties.memoryTypeCount)
	{
		m_iteration	= 0;
		m_stage		= &MemoryTestInstance::createCommandsAndAllocateMemory;

		return true;
	}
	else
	{
		m_stage = DE_NULL;
		return false;
	}
}